

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O2

void Gia_ManBuiltInSimResimulate(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  int iObj;
  int v;
  
  v = 0;
  while( true ) {
    if (p->nObjs <= v) {
      return;
    }
    pGVar1 = Gia_ManObj(p,v);
    if (pGVar1 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar1 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar1) {
      Gia_ManBuiltInSimPerformInt(p,v);
    }
    v = v + 1;
  }
  return;
}

Assistant:

void Gia_ManBuiltInSimResimulate( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;  int iObj;
    Gia_ManForEachAnd( p, pObj, iObj )
        Gia_ManBuiltInSimPerformInt( p, iObj );
}